

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_9bdda5::HandlePrependCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  cmValue cVar4;
  ulong uVar5;
  string_view value_00;
  string value;
  string local_68;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  cmStringRange local_28;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pbVar2 - (long)pbVar1;
  if (uVar5 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"sub-command PREPEND requires at least one argument.",
               (allocator<char> *)&local_48);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (uVar5 == 0x40) goto LAB_002744d8;
    local_28.Begin._M_current = pbVar1 + 2;
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_48;
    local_28.End._M_current = pbVar2;
    cmJoin(&local_68,&local_28,(string_view)(auVar3 << 0x40),(string_view)ZEXT816(0));
    std::__cxx11::string::~string((string *)&local_48);
    cVar4 = cmMakefile::GetDefinition(status->Makefile,pbVar1 + 1);
    if (cVar4.Value != (string *)0x0) {
      std::__cxx11::string::append((string *)&local_68);
    }
    value_00._M_str = local_68._M_dataplus._M_p;
    value_00._M_len = local_68._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,pbVar1 + 1,value_00);
  }
  std::__cxx11::string::~string((string *)&local_68);
LAB_002744d8:
  return 0x20 < uVar5;
}

Assistant:

bool HandlePrependCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command PREPEND requires at least one argument.");
    return false;
  }

  // Skip if nothing to prepend.
  if (args.size() < 3) {
    return true;
  }

  const std::string& variable = args[1];

  std::string value = cmJoin(cmMakeRange(args).advance(2), std::string());
  cmValue oldValue = status.GetMakefile().GetDefinition(variable);
  if (oldValue) {
    value += *oldValue;
  }
  status.GetMakefile().AddDefinition(variable, value);
  return true;
}